

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O3

void __thiscall FListMenuItemPlayerDisplay::UpdateTranslation(FListMenuItemPlayerDisplay *this)

{
  int color;
  long lVar1;
  PClassPlayerPawn *pPVar2;
  undefined8 *puVar3;
  Node *pNVar4;
  int iVar5;
  uint uVar6;
  undefined8 *puVar7;
  Node *pNVar8;
  undefined8 *puVar9;
  FPlayerColorSet *colorset;
  
  lVar1 = (&DAT_017e1e78)[(long)consoleplayer * 0x54];
  uVar6 = (&DAT_017e1e88)[(long)consoleplayer * 0xa8] + 0x3ff;
  puVar3 = (undefined8 *)(lVar1 + (ulong)(uVar6 & 0x204) * 0x18);
  do {
    puVar9 = puVar3;
    puVar3 = (undefined8 *)*puVar9;
  } while (*(int *)(puVar9 + 1) != 0x204);
  color = *(int *)(puVar9[2] + 0x28);
  puVar3 = (undefined8 *)(lVar1 + (ulong)(uVar6 & 0x208) * 0x18);
  do {
    puVar9 = puVar3;
    puVar3 = (undefined8 *)*puVar9;
  } while (*(int *)(puVar9 + 1) != 0x208);
  puVar3 = (undefined8 *)(lVar1 + (ulong)(uVar6 & 0x237) * 0x18);
  do {
    puVar7 = puVar3;
    puVar3 = (undefined8 *)*puVar7;
  } while (*(int *)(puVar7 + 1) != 0x237);
  if (this->mPlayerClass == (FPlayerClass *)0x0) {
    return;
  }
  uVar6 = *(uint *)(puVar7[2] + 0x28);
  iVar5 = R_FindSkin(skins[*(int *)(puVar9[2] + 0x28)].name,
                     (int)((ulong)((long)this->mPlayerClass - (long)PlayerClasses.Array) >> 5));
  pPVar2 = this->mPlayerClass->Type;
  pNVar4 = (pPVar2->ColorSets).Nodes + ((pPVar2->ColorSets).Size - 1 & uVar6);
  while ((pNVar8 = pNVar4, pNVar8 != (Node *)0x0 && (pNVar8->Next != (Node *)0x1))) {
    pNVar4 = pNVar8->Next;
    if ((pNVar8->Pair).Key == uVar6) {
LAB_003167a9:
      colorset = &(pNVar8->Pair).Value;
      if (pNVar8 == (Node *)0x0) {
        colorset = (FPlayerColorSet *)0x0;
      }
      R_GetPlayerTranslation
                (color,colorset,skins + iVar5,
                 translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[8].Ptr);
      return;
    }
  }
  pNVar8 = (Node *)0x0;
  goto LAB_003167a9;
}

Assistant:

void FListMenuItemPlayerDisplay::UpdateTranslation()
{
	int PlayerColor = players[consoleplayer].userinfo.GetColor();
	int	PlayerSkin = players[consoleplayer].userinfo.GetSkin();
	int PlayerColorset = players[consoleplayer].userinfo.GetColorSet();

	if (mPlayerClass != NULL)
	{
		PlayerSkin = R_FindSkin (skins[PlayerSkin].name, int(mPlayerClass - &PlayerClasses[0]));
		R_GetPlayerTranslation(PlayerColor, mPlayerClass->Type->GetColorSet(PlayerColorset),
			&skins[PlayerSkin], translationtables[TRANSLATION_Players][MAXPLAYERS]);
	}
}